

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::quath> *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  ulong uVar2;
  half4 v;
  half4 local_18;
  
  local_18._M_elems._1_7_ = in_register_00000001;
  local_18._M_elems[0].value._0_1_ = in_AL;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_18);
    if (bVar1) {
      uVar2 = ((ulong)local_18._M_elems >> 0x30) << 0x20;
      if (value->has_value_ == true) {
        value->contained =
             (storage_t<tinyusdz::value::quath>)
             ((ulong)local_18._M_elems >> 0x10 & 0xffffffff |
             uVar2 | (long)local_18._M_elems << 0x30);
      }
      else {
        value->contained =
             (storage_t<tinyusdz::value::quath>)
             ((ulong)local_18._M_elems >> 0x10 & 0xffffffff |
             uVar2 | (long)local_18._M_elems << 0x30);
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::quath> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::quath v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}